

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::TParseContext::lValueErrorCheck
          (TParseContext *this,TSourceLoc *loc,char *op,TIntermTyped *node)

{
  int iVar1;
  TIntermediate *pTVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  long *plVar6;
  long lVar7;
  undefined8 uVar8;
  long *plVar9;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte bVar10;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  undefined8 *puVar14;
  int offset [4];
  char *local_50;
  int local_48 [6];
  
  iVar5 = (*(node->super_TIntermNode)._vptr_TIntermNode[8])(node);
  plVar9 = (long *)CONCAT44(extraout_var,iVar5);
  if (plVar9 != (long *)0x0) {
    iVar5 = (int)plVar9[0x17];
    if (iVar5 - 0x33U < 2) {
      if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
        plVar6 = (long *)(**(code **)(*plVar9 + 400))(plVar9);
        plVar6 = (long *)(**(code **)(*plVar6 + 0xf0))(plVar6);
        lVar7 = (**(code **)(*plVar6 + 0x58))(plVar6);
        if (((*(uint *)(lVar7 + 8) & 0x7f) == 4) &&
           (lVar7 = (**(code **)(*plVar6 + 0x58))(plVar6), (*(byte *)(lVar7 + 0xd) & 0x10) == 0)) {
          plVar6 = (long *)(**(code **)(*plVar9 + 400))(plVar9);
          lVar7 = (**(code **)(*plVar6 + 0x60))(plVar6);
          if (lVar7 != 0) {
            plVar6 = (long *)(**(code **)(*plVar9 + 0x198))(plVar9);
            plVar6 = (long *)(**(code **)(*plVar6 + 0x60))(plVar6);
            if ((plVar6 == (long *)0x0) ||
               (lVar7 = (**(code **)(*plVar6 + 0x110))(plVar6),
               (*(uint *)(lVar7 + 8) & 0xff80) != 0x1980)) {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,
                         "tessellation-control per-vertex output l-value must be indexed with gl_InvocationID"
                         ,"[]","");
            }
          }
        }
      }
      iVar5 = (int)plVar9[0x17];
    }
    else if (iVar5 == 0x36) {
      uVar8 = (**(code **)(*plVar9 + 400))(plVar9);
      iVar5 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x42])
                        (this,loc,op,uVar8);
      if ((char)iVar5 != '\0') {
        return true;
      }
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      plVar9 = (long *)(**(code **)(*plVar9 + 0x198))(plVar9);
      plVar9 = (long *)(**(code **)(*plVar9 + 0x30))(plVar9);
      lVar7 = (**(code **)(*plVar9 + 400))(plVar9);
      puVar14 = *(undefined8 **)(lVar7 + 8);
      do {
        lVar7 = (**(code **)(*plVar9 + 400))(plVar9);
        if (puVar14 == *(undefined8 **)(lVar7 + 0x10)) {
          return false;
        }
        plVar6 = (long *)(**(code **)(*(long *)*puVar14 + 0x18))();
        lVar7 = (**(code **)(*plVar6 + 0x28))(plVar6);
        iVar5 = **(int **)(*(long *)(lVar7 + 0xc0) + 8);
        iVar1 = local_48[iVar5];
        local_48[iVar5] = iVar1 + 1;
        puVar14 = puVar14 + 1;
      } while (iVar1 < 1);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc," l-value of swizzle cannot have duplicate components",op,"","");
      return true;
    }
    if (iVar5 == 0x35) {
      lVar7 = (**(code **)(*plVar9 + 400))(plVar9);
      iVar5 = (**(code **)(*(long *)(lVar7 + 0x20) + 0x38))(lVar7 + 0x20);
      if (iVar5 == 0x12) {
        return false;
      }
    }
  }
  bVar3 = TParseContextBase::lValueErrorCheck(&this->super_TParseContextBase,loc,op,node);
  if (bVar3) {
    return true;
  }
  iVar5 = (*(node->super_TIntermNode)._vptr_TIntermNode[0xc])(node);
  plVar6 = (long *)CONCAT44(extraout_var_00,iVar5);
  if (plVar6 == (long *)0x0) {
    local_50 = (char *)0x0;
  }
  else {
    lVar7 = (**(code **)(*plVar6 + 400))(plVar6);
    local_50 = *(char **)(lVar7 + 8);
  }
  iVar5 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
  uVar11 = *(uint *)(CONCAT44(extraout_var_01,iVar5) + 8) & 0x7f;
  bVar4 = 1;
  pcVar13 = (char *)0x0;
  switch(uVar11) {
  case 0xf:
    pcVar13 = (char *)0x0;
    bVar4 = (this->super_TParseContextBase).super_TParseVersions.language != EShLangMesh;
    if (!(bool)bVar4) {
      pcVar13 = "can\'t modify variable with storage qualifier taskPayloadSharedEXT in mesh shaders"
      ;
    }
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1c:
    break;
  case 0x14:
    pcVar13 = "can\'t modify gl_VertexID";
    goto LAB_004172ce;
  case 0x15:
    pcVar13 = "can\'t modify gl_InstanceID";
    goto LAB_004172ce;
  case 0x19:
    pcVar13 = "can\'t modify gl_FrontFace";
    goto LAB_004172ce;
  case 0x1a:
    pcVar13 = "can\'t modify gl_FragCoord";
    goto LAB_004172ce;
  case 0x1b:
    pcVar13 = "can\'t modify gl_PointCoord";
    goto LAB_004172ce;
  case 0x1d:
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar2->depthReplacing = true;
    if ((this->super_TParseContextBase).super_TParseVersions.profile != EEsProfile)
    goto LAB_0041725f;
    bVar10 = pTVar2->earlyFragmentTests;
    pcVar12 = "can\'t modify gl_FragDepth if using early_fragment_tests";
LAB_00417254:
    bVar4 = bVar10 ^ 1;
    pcVar13 = (char *)0x0;
    if (bVar10 != 0) {
      pcVar13 = pcVar12;
    }
    break;
  case 0x1e:
    pTVar2 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar2->stencilReplacing = true;
    if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
      bVar10 = pTVar2->earlyFragmentTests;
      pcVar12 = "can\'t modify EvqFragStencil if using early_fragment_tests";
      goto LAB_00417254;
    }
LAB_0041725f:
    pcVar13 = (char *)0x0;
    break;
  default:
    if (uVar11 == 3) {
      pcVar13 = "can\'t modify shader input";
      goto LAB_004172ce;
    }
  }
  if (((plVar9 == (long *)0x0) && (plVar6 == (long *)0x0)) && (bVar4 != 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc," l-value required",op,"","");
    return true;
  }
  if (bVar4 != 0) {
    return false;
  }
LAB_004172ce:
  if (plVar6 == (long *)0x0) {
    pcVar12 = "(%s)";
  }
  else {
    pcVar12 = "\"%s\" (%s)";
    pcVar13 = local_50;
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc," l-value required",op,pcVar12,pcVar13);
  return true;
}

Assistant:

bool TParseContext::lValueErrorCheck(const TSourceLoc& loc, const char* op, TIntermTyped* node)
{
    TIntermBinary* binaryNode = node->getAsBinaryNode();

    if (binaryNode) {
        bool errorReturn = false;

        switch(binaryNode->getOp()) {
        case EOpIndexDirect:
        case EOpIndexIndirect:
            // ...  tessellation control shader ...
            // If a per-vertex output variable is used as an l-value, it is a
            // compile-time or link-time error if the expression indicating the
            // vertex index is not the identifier gl_InvocationID.
            if (language == EShLangTessControl) {
                const TType& leftType = binaryNode->getLeft()->getType();
                if (leftType.getQualifier().storage == EvqVaryingOut && ! leftType.getQualifier().patch && binaryNode->getLeft()->getAsSymbolNode()) {
                    // we have a per-vertex output
                    const TIntermSymbol* rightSymbol = binaryNode->getRight()->getAsSymbolNode();
                    if (! rightSymbol || rightSymbol->getQualifier().builtIn != EbvInvocationId)
                        error(loc, "tessellation-control per-vertex output l-value must be indexed with gl_InvocationID", "[]", "");
                }
            }
            break; // left node is checked by base class
        case EOpVectorSwizzle:
            errorReturn = lValueErrorCheck(loc, op, binaryNode->getLeft());
            if (!errorReturn) {
                int offset[4] = {0,0,0,0};

                TIntermTyped* rightNode = binaryNode->getRight();
                TIntermAggregate *aggrNode = rightNode->getAsAggregate();

                for (TIntermSequence::iterator p = aggrNode->getSequence().begin();
                                               p != aggrNode->getSequence().end(); p++) {
                    int value = (*p)->getAsTyped()->getAsConstantUnion()->getConstArray()[0].getIConst();
                    offset[value]++;
                    if (offset[value] > 1) {
                        error(loc, " l-value of swizzle cannot have duplicate components", op, "", "");

                        return true;
                    }
                }
            }

            return errorReturn;
        default:
            break;
        }

        if (errorReturn) {
            error(loc, " l-value required", op, "", "");
            return true;
        }
    }

    if (binaryNode && binaryNode->getOp() == EOpIndexDirectStruct && binaryNode->getLeft()->isReference())
        return false;

    // Let the base class check errors
    if (TParseContextBase::lValueErrorCheck(loc, op, node))
        return true;

    const char* symbol = nullptr;
    TIntermSymbol* symNode = node->getAsSymbolNode();
    if (symNode != nullptr)
        symbol = symNode->getName().c_str();

    const char* message = nullptr;
    switch (node->getQualifier().storage) {
    case EvqVaryingIn:      message = "can't modify shader input";   break;
    case EvqInstanceId:     message = "can't modify gl_InstanceID";  break;
    case EvqVertexId:       message = "can't modify gl_VertexID";    break;
    case EvqFace:           message = "can't modify gl_FrontFace";   break;
    case EvqFragCoord:      message = "can't modify gl_FragCoord";   break;
    case EvqPointCoord:     message = "can't modify gl_PointCoord";  break;
    case EvqFragDepth:
        intermediate.setDepthReplacing();
        // "In addition, it is an error to statically write to gl_FragDepth in the fragment shader."
        if (isEsProfile() && intermediate.getEarlyFragmentTests())
            message = "can't modify gl_FragDepth if using early_fragment_tests";
        break;
    case EvqFragStencil:
        intermediate.setStencilReplacing();
        // "In addition, it is an error to statically write to gl_FragDepth in the fragment shader."
        if (isEsProfile() && intermediate.getEarlyFragmentTests())
            message = "can't modify EvqFragStencil if using early_fragment_tests";
        break;

    case EvqtaskPayloadSharedEXT:
        if (language == EShLangMesh)
            message = "can't modify variable with storage qualifier taskPayloadSharedEXT in mesh shaders";
        break;
    default:
        break;
    }

    if (message == nullptr && binaryNode == nullptr && symNode == nullptr) {
        error(loc, " l-value required", op, "", "");

        return true;
    }

    //
    // Everything else is okay, no error.
    //
    if (message == nullptr)
        return false;

    //
    // If we get here, we have an error and a message.
    //
    if (symNode)
        error(loc, " l-value required", op, "\"%s\" (%s)", symbol, message);
    else
        error(loc, " l-value required", op, "(%s)", message);

    return true;
}